

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_rust.cpp
# Opt level: O0

string * __thiscall
flatbuffers::rust::RustGenerator::TableBuilderArgsAddFuncType
          (string *__return_storage_ptr__,RustGenerator *this,FieldDef *field,string *lifetime)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr___00;
  FullType FVar1;
  allocator<char> local_711;
  string local_710;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_690;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_670;
  undefined1 local_650 [8];
  string typname_9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_610;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_590;
  undefined1 local_570 [8];
  string typname_8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_530;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_510;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b0;
  Type local_490;
  undefined1 local_470 [8];
  string typname_7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  undefined1 local_3c8 [8];
  string typname_6;
  undefined1 local_388 [8];
  string typname_5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  undefined1 local_2a0 [8];
  string typname_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  Type local_1c0;
  undefined1 local_1a0 [8];
  string typname_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  undefined1 local_e0 [8];
  string typname_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 local_50 [8];
  string typname;
  Type *type;
  string *lifetime_local;
  FieldDef *field_local;
  RustGenerator *this_local;
  string *typname_4;
  
  typname.field_2._8_8_ = &field->value;
  FVar1 = anon_unknown_26::GetFullType(&(field->value).type);
  switch(FVar1) {
  case ftInteger:
  case ftFloat:
  case ftBool:
    GetTypeBasic_abi_cxx11_(__return_storage_ptr__,this,(Type *)typname.field_2._8_8_);
    break;
  case ftStruct:
    WrapInNameSpace_abi_cxx11_((string *)local_388,this,*(Definition **)(typname.field_2._8_8_ + 8))
    ;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&typname_6.field_2 + 8),"&",(string *)local_388);
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&typname_6.field_2 + 8),"");
    std::__cxx11::string::~string((string *)(typname_6.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_388);
    break;
  case ftTable:
    WrapInNameSpace_abi_cxx11_((string *)local_3c8,this,*(Definition **)(typname.field_2._8_8_ + 8))
    ;
    std::operator+(&local_428,"flatbuffers::WIPOffset<",(string *)local_3c8);
    std::operator+(&local_408,&local_428,"<");
    std::operator+(&local_3e8,&local_408,lifetime);
    std::operator+(__return_storage_ptr__,&local_3e8,">>");
    std::__cxx11::string::~string((string *)&local_3e8);
    std::__cxx11::string::~string((string *)&local_408);
    std::__cxx11::string::~string((string *)&local_428);
    std::__cxx11::string::~string((string *)local_3c8);
    break;
  case ftEnumKey:
  case ftUnionKey:
    typname_5.field_2._M_local_buf[0xf] = '\0';
    WrapInNameSpace_abi_cxx11_
              (__return_storage_ptr__,this,*(Definition **)(typname.field_2._8_8_ + 0x10));
    break;
  case ftUnionValue:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,
               "flatbuffers::WIPOffset<flatbuffers::UnionWIPOffset>",
               (allocator<char> *)(typname_7.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(typname_7.field_2._M_local_buf + 0xf));
    break;
  case ftString:
    std::operator+(&local_448,"flatbuffers::WIPOffset<&",lifetime);
    std::operator+(__return_storage_ptr__,&local_448," str>");
    std::__cxx11::string::~string((string *)&local_448);
    break;
  case ftVectorOfInteger:
  case ftVectorOfFloat:
  case ftVectorOfBool:
    Type::VectorType(&local_1c0,(Type *)typname.field_2._8_8_);
    GetTypeBasic_abi_cxx11_((string *)local_1a0,this,&local_1c0);
    std::operator+(&local_220,"flatbuffers::WIPOffset<flatbuffers::Vector<",lifetime);
    std::operator+(&local_200,&local_220,", ");
    std::operator+(&local_1e0,&local_200,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0);
    std::operator+(__return_storage_ptr__,&local_1e0,">>");
    std::__cxx11::string::~string((string *)&local_1e0);
    std::__cxx11::string::~string((string *)&local_200);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::~string((string *)local_1a0);
    break;
  case ftVectorOfEnumKey:
    WrapInNameSpace_abi_cxx11_
              ((string *)local_2a0,this,*(Definition **)(typname.field_2._8_8_ + 0x10));
    std::operator+(&local_300,"flatbuffers::WIPOffset<flatbuffers::Vector<",lifetime);
    std::operator+(&local_2e0,&local_300,", ");
    std::operator+(&local_2c0,&local_2e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a0);
    std::operator+(__return_storage_ptr__,&local_2c0,">>");
    std::__cxx11::string::~string((string *)&local_2c0);
    std::__cxx11::string::~string((string *)&local_2e0);
    std::__cxx11::string::~string((string *)&local_300);
    std::__cxx11::string::~string((string *)local_2a0);
    break;
  case ftVectorOfStruct:
    WrapInNameSpace_abi_cxx11_((string *)local_50,this,*(Definition **)(typname.field_2._8_8_ + 8));
    std::operator+(&local_b0,"flatbuffers::WIPOffset<flatbuffers::Vector<",lifetime);
    std::operator+(&local_90,&local_b0,", ");
    std::operator+(&local_70,&local_90,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
    std::operator+(__return_storage_ptr__,&local_70,">>");
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)local_50);
    break;
  case ftVectorOfTable:
    WrapInNameSpace_abi_cxx11_((string *)local_e0,this,*(Definition **)(typname.field_2._8_8_ + 8));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&typname_2.field_2 + 8),"flatbuffers::WIPOffset<flatbuffers::Vector<",
                   lifetime);
    std::operator+(&local_160,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&typname_2.field_2 + 8),", flatbuffers::ForwardsUOffset<");
    std::operator+(&local_140,&local_160,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0);
    std::operator+(&local_120,&local_140,"<");
    std::operator+(&local_100,&local_120,lifetime);
    std::operator+(__return_storage_ptr__,&local_100,">>>>");
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&local_160);
    std::__cxx11::string::~string((string *)(typname_2.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_e0);
    break;
  case ftVectorOfString:
    __return_storage_ptr___00 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ((long)&typname_3.field_2 + 8);
    std::operator+(__return_storage_ptr___00,"flatbuffers::WIPOffset<flatbuffers::Vector<",lifetime)
    ;
    std::operator+(&local_260,__return_storage_ptr___00,", flatbuffers::ForwardsUOffset<&");
    std::operator+(&local_240,&local_260,lifetime);
    std::operator+(__return_storage_ptr__,&local_240," str>>>");
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::string::~string((string *)(typname_3.field_2._M_local_buf + 8));
    break;
  case ftVectorOfUnionValue:
    std::operator+(&local_360,"flatbuffers::WIPOffset<flatbuffers::Vector<",lifetime);
    std::operator+(&local_340,&local_360,", flatbuffers::ForwardsUOffset<flatbuffers::Table<");
    std::operator+(&local_320,&local_340,lifetime);
    std::operator+(__return_storage_ptr__,&local_320,">>>");
    std::__cxx11::string::~string((string *)&local_320);
    std::__cxx11::string::~string((string *)&local_340);
    std::__cxx11::string::~string((string *)&local_360);
    break;
  case ftArrayOfBuiltin:
    Type::VectorType(&local_490,(Type *)typname.field_2._8_8_);
    GetTypeBasic_abi_cxx11_((string *)local_470,this,&local_490);
    std::operator+(&local_530,"flatbuffers::Array<",lifetime);
    std::operator+(&local_510,&local_530,", ");
    std::operator+(&local_4f0,&local_510,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_470);
    std::operator+(&local_4d0,&local_4f0,", ");
    NumToString<unsigned_short>
              ((string *)((long)&typname_8.field_2 + 8),
               *(unsigned_short *)(typname.field_2._8_8_ + 0x18));
    std::operator+(&local_4b0,&local_4d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&typname_8.field_2 + 8));
    std::operator+(__return_storage_ptr__,&local_4b0,">");
    std::__cxx11::string::~string((string *)&local_4b0);
    std::__cxx11::string::~string((string *)(typname_8.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)&local_4d0);
    std::__cxx11::string::~string((string *)&local_4f0);
    std::__cxx11::string::~string((string *)&local_510);
    std::__cxx11::string::~string((string *)&local_530);
    std::__cxx11::string::~string((string *)local_470);
    break;
  case ftArrayOfEnum:
    WrapInNameSpace_abi_cxx11_
              ((string *)local_570,this,*(Definition **)(typname.field_2._8_8_ + 0x10));
    std::operator+(&local_610,"flatbuffers::Array<",lifetime);
    std::operator+(&local_5f0,&local_610,", ");
    std::operator+(&local_5d0,&local_5f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_570);
    std::operator+(&local_5b0,&local_5d0,", ");
    NumToString<unsigned_short>
              ((string *)((long)&typname_9.field_2 + 8),
               *(unsigned_short *)(typname.field_2._8_8_ + 0x18));
    std::operator+(&local_590,&local_5b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&typname_9.field_2 + 8));
    std::operator+(__return_storage_ptr__,&local_590,">");
    std::__cxx11::string::~string((string *)&local_590);
    std::__cxx11::string::~string((string *)(typname_9.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)&local_5b0);
    std::__cxx11::string::~string((string *)&local_5d0);
    std::__cxx11::string::~string((string *)&local_5f0);
    std::__cxx11::string::~string((string *)&local_610);
    std::__cxx11::string::~string((string *)local_570);
    break;
  case ftArrayOfStruct:
    WrapInNameSpace_abi_cxx11_((string *)local_650,this,*(Definition **)(typname.field_2._8_8_ + 8))
    ;
    std::operator+(&local_6f0,"flatbuffers::Array<",lifetime);
    std::operator+(&local_6d0,&local_6f0,", ");
    std::operator+(&local_6b0,&local_6d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_650);
    std::operator+(&local_690,&local_6b0,", ");
    NumToString<unsigned_short>(&local_710,*(unsigned_short *)(typname.field_2._8_8_ + 0x18));
    std::operator+(&local_670,&local_690,&local_710);
    std::operator+(__return_storage_ptr__,&local_670,">");
    std::__cxx11::string::~string((string *)&local_670);
    std::__cxx11::string::~string((string *)&local_710);
    std::__cxx11::string::~string((string *)&local_690);
    std::__cxx11::string::~string((string *)&local_6b0);
    std::__cxx11::string::~string((string *)&local_6d0);
    std::__cxx11::string::~string((string *)&local_6f0);
    std::__cxx11::string::~string((string *)local_650);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"INVALID_CODE_GENERATION",&local_711);
    std::allocator<char>::~allocator(&local_711);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string TableBuilderArgsAddFuncType(const FieldDef &field,
                                          const std::string &lifetime) {
    const Type &type = field.value.type;

    switch (GetFullType(field.value.type)) {
      case ftVectorOfStruct: {
        const auto typname = WrapInNameSpace(*type.struct_def);
        return "flatbuffers::WIPOffset<flatbuffers::Vector<" + lifetime + ", " +
               typname + ">>";
      }
      case ftVectorOfTable: {
        const auto typname = WrapInNameSpace(*type.struct_def);
        return "flatbuffers::WIPOffset<flatbuffers::Vector<" + lifetime +
               ", flatbuffers::ForwardsUOffset<" + typname + "<" + lifetime +
               ">>>>";
      }
      case ftVectorOfInteger:
      case ftVectorOfBool:
      case ftVectorOfFloat: {
        const auto typname = GetTypeBasic(type.VectorType());
        return "flatbuffers::WIPOffset<flatbuffers::Vector<" + lifetime + ", " +
               typname + ">>";
      }
      case ftVectorOfString: {
        return "flatbuffers::WIPOffset<flatbuffers::Vector<" + lifetime +
               ", flatbuffers::ForwardsUOffset<&" + lifetime + " str>>>";
      }
      case ftVectorOfEnumKey: {
        const auto typname = WrapInNameSpace(*type.enum_def);
        return "flatbuffers::WIPOffset<flatbuffers::Vector<" + lifetime + ", " +
               typname + ">>";
      }
      case ftVectorOfUnionValue: {
        return "flatbuffers::WIPOffset<flatbuffers::Vector<" + lifetime +
               ", flatbuffers::ForwardsUOffset<flatbuffers::Table<" + lifetime +
               ">>>";
      }
      case ftEnumKey:
      case ftUnionKey: {
        const auto typname = WrapInNameSpace(*type.enum_def);
        return typname;
      }
      case ftStruct: {
        const auto typname = WrapInNameSpace(*type.struct_def);
        return "&" + typname + "";
      }
      case ftTable: {
        const auto typname = WrapInNameSpace(*type.struct_def);
        return "flatbuffers::WIPOffset<" + typname + "<" + lifetime + ">>";
      }
      case ftInteger:
      case ftBool:
      case ftFloat: {
        return GetTypeBasic(type);
      }
      case ftString: {
        return "flatbuffers::WIPOffset<&" + lifetime + " str>";
      }
      case ftUnionValue: {
        return "flatbuffers::WIPOffset<flatbuffers::UnionWIPOffset>";
      }
      case ftArrayOfBuiltin: {
        const auto typname = GetTypeBasic(type.VectorType());
        return "flatbuffers::Array<" + lifetime + ", " + typname + ", " +
               NumToString(type.fixed_length) + ">";
      }
      case ftArrayOfEnum: {
        const auto typname = WrapInNameSpace(*type.enum_def);
        return "flatbuffers::Array<" + lifetime + ", " + typname + ", " +
               NumToString(type.fixed_length) + ">";
      }
      case ftArrayOfStruct: {
        const auto typname = WrapInNameSpace(*type.struct_def);
        return "flatbuffers::Array<" + lifetime + ", " + typname + ", " +
               NumToString(type.fixed_length) + ">";
      }
    }

    return "INVALID_CODE_GENERATION";  // for return analysis
  }